

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O3

bool QtPrivate::QEqualityOperatorForType<QLine,_true>::equals
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  undefined4 in_EAX;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  
  iVar3 = -(uint)((int)*b == (int)*a);
  iVar4 = -(uint)((int)((ulong)*b >> 0x20) == (int)((ulong)*a >> 0x20));
  auVar1._4_4_ = iVar3;
  auVar1._0_4_ = iVar3;
  auVar1._8_4_ = iVar4;
  auVar1._12_4_ = iVar4;
  iVar3 = movmskpd(in_EAX,auVar1);
  if (iVar3 == 3) {
    iVar3 = -(uint)((int)*(undefined8 *)((long)b + 8) == (int)*(undefined8 *)((long)a + 8));
    iVar4 = -(uint)((int)((ulong)*(undefined8 *)((long)b + 8) >> 0x20) ==
                   (int)((ulong)*(undefined8 *)((long)a + 8) >> 0x20));
    auVar2._4_4_ = iVar3;
    auVar2._0_4_ = iVar3;
    auVar2._8_4_ = iVar4;
    auVar2._12_4_ = iVar4;
    iVar3 = movmskpd(3,auVar2);
    return iVar3 == 3;
  }
  return false;
}

Assistant:

Q_DECLARE_STRONGLY_ORDERED_LITERAL_TYPE(
        QCheckedInt,
        AInt,
        template <typename AInt, if_is_same_int<AInt> = true>)
};

template <typename Int, typename I, typename P>
Q_DECL_CONST_FUNCTION size_t constexpr inline qHash(QCheckedInt<Int, I, P> key, size_t seed = 0) noexcept
{
    using QT_PREPEND_NAMESPACE(qHash);
    return qHash(key.value(), seed);
}